

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmCas<(moira::Instr)143,(moira::Mode)5,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  u32 ext_00;
  StrWriter *pSVar3;
  Av<(moira::Instr)143,_(moira::Mode)5,_1> local_64 [2];
  i32 local_5c;
  i32 local_54;
  int local_50;
  undefined1 local_48 [8];
  Ea<(moira::Mode)5,_1> dst;
  Dn du;
  Dn dc;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uVar1 = *addr;
  ext_00 = dasmIncRead<2>(this,addr);
  Dn::Dn((Dn *)&dst.ext3,ext_00 & 7);
  Dn::Dn((Dn *)&dst.ext2,ext_00 >> 6 & 7);
  Op<(moira::Mode)5,1>((Ea<(moira::Mode)5,_1> *)local_48,this,op & 7,addr);
  if (((str->style->syntax != GNU) && (str->style->syntax != GNU_MIT)) ||
     (bVar2 = isValidExt(this,CAS,DI,op,ext_00), bVar2)) {
    pSVar3 = StrWriter::operator<<(str);
    pSVar3 = StrWriter::operator<<(pSVar3);
    local_50 = (str->tab).raw;
    pSVar3 = StrWriter::operator<<(pSVar3,(Tab)local_50);
    local_54 = dst.ext3;
    pSVar3 = StrWriter::operator<<(pSVar3,(Dn)dst.ext3);
    pSVar3 = StrWriter::operator<<(pSVar3);
    local_5c = dst.ext2;
    pSVar3 = StrWriter::operator<<(pSVar3,(Dn)dst.ext2);
    pSVar3 = StrWriter::operator<<(pSVar3);
    StrWriter::operator<<(pSVar3,(Ea<(moira::Mode)5,_1> *)local_48);
    local_64[0].ext1 = 0;
    StrWriter::operator<<(str,local_64);
  }
  else {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)143,(moira::Mode)5,1>(this,str,addr,op);
  }
  return;
}

Assistant:

void
Moira::dasmCas(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto dc  = Dn ( _____________xxx(ext) );
    auto du  = Dn ( _______xxx______(ext) );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Sz<S>{} << str.tab << dc << Sep{} << du << Sep{} << dst;
    str << Av<I, M, S>{};
}